

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O0

void __thiscall amrex::BLBTer::~BLBTer(BLBTer *this)

{
  string *in_RDI;
  
  pop_bt_stack((BLBTer *)in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

BLBTer::~BLBTer()
{
#ifdef AMREX_USE_OMP
    if (omp_in_parallel()) {
        pop_bt_stack();
    }
    else {
        #pragma omp parallel
        {
            pop_bt_stack();
        }
    }
#else
    pop_bt_stack();
#endif
}